

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

string * __thiscall
t_netstd_generator::make_csharp_string_literal
          (string *__return_storage_ptr__,t_netstd_generator *this,string *value)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  ostream *poVar6;
  size_type sVar7;
  stringstream result;
  ostream local_1a8;
  
  if (value->_M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&result);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&result);
    std::operator<<(&local_1a8,"\"");
    pcVar2 = (value->_M_dataplus)._M_p;
    sVar3 = value->_M_string_length;
    for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
      cVar1 = pcVar2[sVar7];
      if ((uint)(int)cVar1 < 0x20) {
        poVar6 = std::operator<<(&local_1a8,"\\x");
        pp_Var4 = poVar6->_vptr_basic_ostream;
        p_Var5 = pp_Var4[-3];
        *(uint *)(&poVar6->field_0x18 + (long)p_Var5) =
             *(uint *)(&poVar6->field_0x18 + (long)p_Var5) & 0xffffffb5 | 8;
        *(undefined8 *)(&poVar6->field_0x10 + (long)pp_Var4[-3]) = 4;
        poVar6 = std::operator<<(poVar6,0x30);
        std::ostream::operator<<(poVar6,(int)cVar1);
      }
      else {
        if ((cVar1 == '\\') || (poVar6 = &local_1a8, cVar1 == '\"')) {
          poVar6 = std::operator<<(&local_1a8,"\\");
        }
        std::operator<<(poVar6,cVar1);
      }
    }
    std::operator<<(&local_1a8,"\"");
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&result);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::make_csharp_string_literal( string const& value)
{
  if (value.length() == 0) {
    return "";
  }

  std::stringstream result;
  result << "\"";
  for (signed char const c: value) {
    if( (c >= 0) && (c < 32)) {  // convert ctrl chars, but leave UTF-8 alone
      int width = std::max( (int)sizeof(c), 4);
      result << "\\x" << std::hex << std::setw(width) << std::setfill('0') << (int)c;
    } else if ((c == '\\') || (c == '"')) {
      result << "\\" << c;
    } else {
      result << c;   // anything else "as is"
    }
  }
  result << "\"";

  return result.str();
}